

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O2

int GET(_PDCLIB_status_t *status)

{
  byte bVar1;
  unsigned_long uVar2;
  int iVar3;
  uchar *puVar4;
  _PDCLIB_file_t *stream;
  
  stream = status->stream;
  if (stream == (_PDCLIB_file_t *)0x0) {
    puVar4 = (uchar *)status->s;
    if (*puVar4 == 0) {
      return -1;
    }
    status->s = (char *)(puVar4 + 1);
  }
  else {
    if ((stream->bufidx == stream->bufend) && (stream->ungetidx == 0)) {
      iVar3 = _PDCLIB_fillbuffer(stream);
      if (iVar3 == -1) {
        return -1;
      }
      stream = status->stream;
    }
    uVar2 = stream->ungetidx;
    if (uVar2 == 0) {
      uVar2 = stream->bufidx;
      stream->bufidx = uVar2 + 1;
      puVar4 = (uchar *)(stream->buffer + uVar2);
    }
    else {
      stream->ungetidx = uVar2 - 1;
      puVar4 = stream->ungetbuf + (uVar2 - 1);
    }
  }
  bVar1 = *puVar4;
  status->i = status->i + 1;
  status->current = status->current + 1;
  return (uint)bVar1;
}

Assistant:

static int GET( struct _PDCLIB_status_t * status )
{
    int rc = EOF;

    if ( status->stream != NULL )
    {
        if ( _PDCLIB_CHECKBUFFER( status->stream ) != EOF )
        {
            rc = _PDCLIB_GETC( status->stream );
        }
    }
    else
    {
        rc = ( *status->s == '\0' ) ? EOF : ( unsigned char ) * ( ( status->s )++ );
    }

    if ( rc != EOF )
    {
        ++( status->i );
        ++( status->current );
    }

    return rc;
}